

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

MaxLayerParams * __thiscall
CoreML::Specification::MaxLayerParams::New(MaxLayerParams *this,Arena *arena)

{
  MaxLayerParams *this_00;
  
  this_00 = (MaxLayerParams *)operator_new(0x18);
  MaxLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::MaxLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

MaxLayerParams* MaxLayerParams::New(::google::protobuf::Arena* arena) const {
  MaxLayerParams* n = new MaxLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}